

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_>::expand
          (Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_> *this)

{
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *ppVar1;
  undefined8 *puVar2;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *ppVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  uVar4 = sVar7 * 0x48;
  if (uVar4 == 0) {
    ppVar3 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x11) {
    ppVar3 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar4 < 0x19) {
    ppVar3 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar4 < 0x21) {
    ppVar3 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    ppVar3 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    ppVar3 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ppVar3 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)::operator_new(uVar4,0x10);
  }
  if (this->_capacity != 0) {
    uVar4 = this->_capacity;
    if (uVar4 != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>::pair
                  ((pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
                   ((long)&(ppVar3->first)._capacity + lVar6),
                   (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
                   ((long)&(this->_stack->first)._capacity + lVar6));
        ppVar1 = this->_stack;
        this_00 = (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                  ((long)&(ppVar1->second)._map._timestamp + lVar6);
        DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap(this_00);
        puVar2 = *(undefined8 **)&this_00[-1]._capacity;
        if (puVar2 != (undefined8 *)0x0) {
          uVar4 = *(long *)((long)&(ppVar1->first)._capacity + lVar6) * 8 + 0xfU &
                  0xfffffffffffffff0;
          if (uVar4 == 0) {
            *puVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar2;
          }
          else if (uVar4 < 0x11) {
            *puVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar2;
          }
          else if (uVar4 < 0x19) {
            *puVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar2;
          }
          else if (uVar4 < 0x21) {
            *puVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar2;
          }
          else if (uVar4 < 0x31) {
            *puVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar2;
          }
          else if (uVar4 < 0x41) {
            *puVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar2;
          }
          else {
            operator_delete(puVar2,0x10);
          }
        }
        uVar5 = uVar5 + 1;
        uVar4 = this->_capacity;
        lVar6 = lVar6 + 0x48;
      } while (uVar5 < uVar4);
    }
    ppVar1 = this->_stack;
    if (ppVar1 != (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)0x0) {
      uVar4 = uVar4 * 0x48 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        (ppVar1->first)._capacity = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppVar1;
      }
      else if (uVar4 < 0x11) {
        (ppVar1->first)._capacity = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppVar1;
      }
      else if (uVar4 < 0x19) {
        (ppVar1->first)._capacity = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppVar1;
      }
      else if (uVar4 < 0x21) {
        (ppVar1->first)._capacity = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppVar1;
      }
      else if (uVar4 < 0x31) {
        (ppVar1->first)._capacity = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppVar1;
      }
      else if (uVar4 < 0x41) {
        (ppVar1->first)._capacity = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppVar1;
      }
      else {
        operator_delete(ppVar1,0x10);
      }
    }
  }
  this->_stack = ppVar3;
  this->_cursor = ppVar3 + this->_capacity;
  this->_end = ppVar3 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }